

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.hpp
# Opt level: O2

void __thiscall helics::BrokerKeeper::~BrokerKeeper(BrokerKeeper *this)

{
  bool bVar1;
  
  bVar1 = BrokerApp::isConnected(&this->brk);
  if (bVar1) {
    BrokerApp::waitForDisconnect(&this->brk,(milliseconds)0x0);
  }
  BrokerApp::~BrokerApp(&this->brk);
  return;
}

Assistant:

~BrokerKeeper()
    {
        if (brk.isConnected()) {
            brk.waitForDisconnect();
        }
    }